

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void wasm::ControlFlowWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::scan
               (Walker *self,Expression **currp)

{
  Expression *pEVar1;
  uint uVar2;
  Expression *curr;
  Expression **currp_local;
  Walker *self_local;
  
  pEVar1 = *currp;
  uVar2 = (uint)pEVar1->_id;
  if ((uVar2 - 1 < 3) || (uVar2 == 0x34 || uVar2 == 0x35)) {
    Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::pushTask
              ((Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_> *)self,
               UniqueNameMapper::uniquify(wasm::Expression*)::Walker::
               doPostVisitControlFlow(Walker*,wasm::Expression___,currp);
  }
  PostWalker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::scan(self,currp);
  uVar2 = (uint)pEVar1->_id;
  if ((uVar2 - 1 < 3) || (uVar2 == 0x34 || uVar2 == 0x35)) {
    Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_>::pushTask
              ((Walker<Walker,_wasm::UnifiedExpressionVisitor<Walker,_void>_> *)self,
               UniqueNameMapper::uniquify(wasm::Expression*)::Walker::
               doPreVisitControlFlow(Walker*,wasm::Expression___,currp);
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    auto* curr = *currp;

    switch (curr->_id) {
      case Expression::Id::BlockId:
      case Expression::Id::IfId:
      case Expression::Id::LoopId:
      case Expression::Id::TryId:
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doPostVisitControlFlow, currp);
        break;
      }
      default: {
      }
    }

    PostWalker<SubType, VisitorType>::scan(self, currp);

    switch (curr->_id) {
      case Expression::Id::BlockId:
      case Expression::Id::IfId:
      case Expression::Id::LoopId:
      case Expression::Id::TryId:
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doPreVisitControlFlow, currp);
        break;
      }
      default: {
      }
    }
  }